

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Chapters::Edition::ExpandAtomsArray(Edition *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  ulong *puVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  Atom *pAVar10;
  long lVar11;
  
  iVar3 = this->m_atoms_size;
  if (this->m_atoms_count < iVar3) {
    return true;
  }
  iVar7 = 1;
  if (iVar3 != 0) {
    iVar7 = iVar3 * 2;
  }
  uVar9 = (ulong)iVar7;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar9;
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x30),8) == 0) {
    uVar8 = SUB168(auVar4 * ZEXT816(0x30),0) | 8;
  }
  puVar6 = (ulong *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
  if (puVar6 == (ulong *)0x0) {
    return false;
  }
  *puVar6 = uVar9;
  lVar11 = 0;
  pAVar10 = (Atom *)(puVar6 + 1);
  do {
    Atom::Atom(pAVar10);
    lVar11 = lVar11 + -0x30;
    pAVar10 = pAVar10 + 1;
  } while (-lVar11 != uVar9 * 0x30);
  iVar3 = this->m_atoms_count;
  pAVar10 = this->m_atoms;
  if ((long)iVar3 < 1) {
    if (pAVar10 == (Atom *)0x0) goto LAB_0015834d;
  }
  else {
    lVar11 = 0;
    do {
      *(undefined8 *)((long)puVar6 + lVar11 + 8) =
           *(undefined8 *)((long)&pAVar10->m_string_uid + lVar11);
      puVar1 = (undefined8 *)((long)&pAVar10->m_uid + lVar11);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)puVar6 + lVar11 + 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      *(undefined8 *)((long)puVar6 + lVar11 + 0x20) =
           *(undefined8 *)((long)&pAVar10->m_stop_timecode + lVar11);
      *(undefined8 *)((long)puVar6 + lVar11 + 0x28) =
           *(undefined8 *)((long)&pAVar10->m_displays + lVar11);
      *(undefined8 *)((long)puVar6 + lVar11 + 0x30) =
           *(undefined8 *)((long)&pAVar10->m_displays_size + lVar11);
      lVar11 = lVar11 + 0x30;
    } while ((long)iVar3 * 0x30 != lVar11);
  }
  if (*(long *)&pAVar10[-1].m_displays_size != 0) {
    lVar11 = *(long *)&pAVar10[-1].m_displays_size * 0x30;
    do {
      Atom::~Atom((Atom *)((long)&pAVar10[-1].m_string_uid + lVar11));
      lVar11 = lVar11 + -0x30;
    } while (lVar11 != 0);
  }
  operator_delete__(&pAVar10[-1].m_displays_size);
LAB_0015834d:
  this->m_atoms = (Atom *)(puVar6 + 1);
  this->m_atoms_size = iVar7;
  return true;
}

Assistant:

bool Chapters::Edition::ExpandAtomsArray() {
  if (m_atoms_size > m_atoms_count)
    return true;  // nothing else to do

  const int size = (m_atoms_size == 0) ? 1 : 2 * m_atoms_size;

  Atom* const atoms = new (std::nothrow) Atom[size];

  if (atoms == NULL)
    return false;

  for (int idx = 0; idx < m_atoms_count; ++idx) {
    m_atoms[idx].ShallowCopy(atoms[idx]);
  }

  delete[] m_atoms;
  m_atoms = atoms;

  m_atoms_size = size;
  return true;
}